

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

pair<mjs::token,_unsigned_long> * __thiscall
mjs::anon_unknown_2::get_identifier
          (pair<mjs::token,_unsigned_long> *__return_storage_ptr__,anon_unknown_2 *this,
          wstring_view text,size_t token_start,version ver)

{
  int *piVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  runtime_error *prVar7;
  anon_unknown_2 *paVar8;
  uint *puVar9;
  ulong uVar10;
  version ver_00;
  code *pcVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  wstring id;
  token tok;
  wstring local_c0;
  token local_a0;
  token local_78;
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  
  paVar8 = (anon_unknown_2 *)text._M_str;
  piVar1 = (int *)(text._M_len + (long)paVar8 * 4);
  bVar14 = *piVar1 == 0x5c;
  ver_00 = (version)token_start;
  pcVar11 = is_identifier_part_v3;
  if (1 < (int)ver_00) {
    pcVar11 = is_identifier_part_v5;
  }
  puVar9 = (uint *)(text._M_len + (long)paVar8 * 4);
  do {
    paVar8 = paVar8 + 1;
    puVar9 = puVar9 + 1;
    if (this <= paVar8) break;
    uVar4 = *puVar9;
    cVar2 = '\x01';
    bVar3 = bVar14;
    if (((uVar4 != 0x24) && (uVar4 != 0x5f)) &&
       (bVar12 = (uVar4 & 0xffffffdf) - 0x41 < 0x1a, bVar13 = uVar4 - 0x30 < 10,
       cVar2 = bVar13 || bVar12, 0 < (int)ver_00 && (!bVar13 && !bVar12))) {
      cVar2 = '\x01';
      bVar3 = true;
      if (uVar4 != 0x5c) {
        cVar2 = (*pcVar11)();
        bVar3 = bVar14;
      }
    }
    bVar14 = bVar3;
  } while (cVar2 != '\0');
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_c0,piVar1,puVar9);
  local_78.type_ = eof;
  if (bVar14) {
    uVar6 = std::__cxx11::wstring::find((wchar_t)&local_c0,0x5c);
    if (uVar6 == 0xffffffffffffffff) {
      __assert_fail("idx != std::wstring::npos",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                    ,0xb8,
                    "std::wstring mjs::(anonymous namespace)::replace_unicode_escape_sequences(const std::wstring &, version)"
                   );
    }
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    uVar10 = 0;
    do {
      if (local_c0._M_dataplus._M_p[uVar6] != L'\\') {
        __assert_fail("id[idx] == \'\\\\\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                      ,0xbd,
                      "std::wstring mjs::(anonymous namespace)::replace_unicode_escape_sequences(const std::wstring &, version)"
                     );
      }
      if (uVar6 != uVar10) {
        std::__cxx11::wstring::substr((ulong)&local_a0,(ulong)&local_c0);
        std::__cxx11::wstring::_M_append
                  ((wchar_t *)&local_50,CONCAT44(local_a0._4_4_,local_a0.type_));
        if ((void *)CONCAT44(local_a0._4_4_,local_a0.type_) != (void *)((long)&local_a0.field_1 + 8)
           ) {
          operator_delete((void *)CONCAT44(local_a0._4_4_,local_a0.type_),
                          local_a0.field_1.text_._M_string_length * 4 + 4);
        }
      }
      uVar10 = uVar6 + 6;
      if ((local_c0._M_string_length < uVar10) ||
         ((local_c0._M_dataplus._M_p[uVar6 + 1] | 0x20U) != 0x75)) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"Illegal unicode escape sequence in identfier");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar4 = get_hex_value4(local_c0._M_dataplus._M_p + uVar6 + 2);
      bVar3 = is_identifier_part(uVar4 & 0xffff,ver_00);
      if (!bVar3) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"Illegal unicode escape sequence in identfier");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::wstring::push_back((wchar_t)&local_50);
      uVar6 = std::__cxx11::wstring::find((wchar_t)&local_c0,0x5c);
    } while (uVar6 != 0xffffffffffffffff);
    std::__cxx11::wstring::substr((ulong)&local_a0,(ulong)&local_c0);
    std::__cxx11::wstring::_M_append((wchar_t *)&local_50,CONCAT44(local_a0._4_4_,local_a0.type_));
    if ((void *)CONCAT44(local_a0._4_4_,local_a0.type_) != (void *)((long)&local_a0.field_1 + 8)) {
      operator_delete((void *)CONCAT44(local_a0._4_4_,local_a0.type_),
                      local_a0.field_1.text_._M_string_length * 4 + 4);
    }
    std::__cxx11::wstring::operator=((wstring *)&local_c0,(wstring *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT44(uStack_3c,local_40) * 4 + 4);
    }
  }
  if (ver_00 == es3) {
    iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
    if (iVar5 == 0) {
      local_a0.type_ = abstract_;
      token::operator=(&local_78,&local_a0);
      token::destroy(&local_a0);
      goto LAB_00171e20;
    }
    iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
    if (iVar5 == 0) {
      local_a0.type_ = boolean_;
      token::operator=(&local_78,&local_a0);
      token::destroy(&local_a0);
      goto LAB_00171e20;
    }
  }
  if ((ver_00 < (es5|es3)) &&
     (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
    local_a0.type_ = break_;
    token::operator=(&local_78,&local_a0);
    token::destroy(&local_a0);
  }
  else if ((ver_00 == es3) &&
          (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
    local_a0.type_ = byte_;
    token::operator=(&local_78,&local_a0);
    token::destroy(&local_a0);
  }
  else {
    if (ver_00 < (es5|es3)) {
      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
      if (iVar5 == 0) {
        local_a0.type_ = case_;
        token::operator=(&local_78,&local_a0);
        token::destroy(&local_a0);
        goto LAB_00171e20;
      }
      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
      if (iVar5 == 0) {
        local_a0.type_ = catch_;
        token::operator=(&local_78,&local_a0);
        token::destroy(&local_a0);
        goto LAB_00171e20;
      }
    }
    if ((ver_00 == es3) &&
       (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
      local_a0.type_ = char_;
      token::operator=(&local_78,&local_a0);
      token::destroy(&local_a0);
    }
    else {
      if (ver_00 < (es5|es3)) {
        iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
        if (iVar5 == 0) {
          local_a0.type_ = class_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
          goto LAB_00171e20;
        }
        iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
        if (iVar5 == 0) {
          local_a0.type_ = const_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
          goto LAB_00171e20;
        }
        iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
        if (iVar5 == 0) {
          local_a0.type_ = continue_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
          goto LAB_00171e20;
        }
        iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
        if (iVar5 == 0) {
          local_a0.type_ = debugger_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
          goto LAB_00171e20;
        }
        iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
        if (iVar5 == 0) {
          local_a0.type_ = default_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
          goto LAB_00171e20;
        }
        iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
        if (iVar5 == 0) {
          local_a0.type_ = delete_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
          goto LAB_00171e20;
        }
        iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
        if (iVar5 == 0) {
          local_a0.type_ = do_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
          goto LAB_00171e20;
        }
      }
      if ((ver_00 == es3) &&
         (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
        local_a0.type_ = double_;
        token::operator=(&local_78,&local_a0);
        token::destroy(&local_a0);
      }
      else {
        if (ver_00 < (es5|es3)) {
          iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
          if (iVar5 == 0) {
            local_a0.type_ = else_;
            token::operator=(&local_78,&local_a0);
            token::destroy(&local_a0);
            goto LAB_00171e20;
          }
          iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
          if (iVar5 == 0) {
            local_a0.type_ = enum_;
            token::operator=(&local_78,&local_a0);
            token::destroy(&local_a0);
            goto LAB_00171e20;
          }
          iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
          if (iVar5 == 0) {
            local_a0.type_ = export_;
            token::operator=(&local_78,&local_a0);
            token::destroy(&local_a0);
            goto LAB_00171e20;
          }
          iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
          if (iVar5 == 0) {
            local_a0.type_ = extends_;
            token::operator=(&local_78,&local_a0);
            token::destroy(&local_a0);
            goto LAB_00171e20;
          }
          iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
          if (iVar5 == 0) {
            local_a0.type_ = false_;
            token::operator=(&local_78,&local_a0);
            token::destroy(&local_a0);
            goto LAB_00171e20;
          }
        }
        if ((ver_00 == es3) &&
           (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
          local_a0.type_ = final_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
        }
        else if ((ver_00 < (es5|es3)) &&
                (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
          local_a0.type_ = finally_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
        }
        else if ((ver_00 == es3) &&
                (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
          local_a0.type_ = float_;
          token::operator=(&local_78,&local_a0);
          token::destroy(&local_a0);
        }
        else {
          if (ver_00 < (es5|es3)) {
            iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
            if (iVar5 == 0) {
              local_a0.type_ = for_;
              token::operator=(&local_78,&local_a0);
              token::destroy(&local_a0);
              goto LAB_00171e20;
            }
            iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
            if (iVar5 == 0) {
              local_a0.type_ = function_;
              token::operator=(&local_78,&local_a0);
              token::destroy(&local_a0);
              goto LAB_00171e20;
            }
          }
          if ((ver_00 == es3) &&
             (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
            local_a0.type_ = goto_;
            token::operator=(&local_78,&local_a0);
            token::destroy(&local_a0);
          }
          else if ((ver_00 < (es5|es3)) &&
                  (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
            local_a0.type_ = if_;
            token::operator=(&local_78,&local_a0);
            token::destroy(&local_a0);
          }
          else {
            uVar4 = ver_00 - es3;
            if ((uVar4 < 2) &&
               (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
              local_a0.type_ = implements_;
              token::operator=(&local_78,&local_a0);
              token::destroy(&local_a0);
            }
            else {
              if (ver_00 < (es5|es3)) {
                iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                if (iVar5 == 0) {
                  local_a0.type_ = import_;
                  token::operator=(&local_78,&local_a0);
                  token::destroy(&local_a0);
                  goto LAB_00171e20;
                }
                iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                if (iVar5 == 0) {
                  local_a0.type_ = in_;
                  token::operator=(&local_78,&local_a0);
                  token::destroy(&local_a0);
                  goto LAB_00171e20;
                }
              }
              if ((uVar4 < 2) &&
                 (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
                local_a0.type_ = instanceof_;
                token::operator=(&local_78,&local_a0);
                token::destroy(&local_a0);
              }
              else if ((ver_00 == es3) &&
                      (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
                local_a0.type_ = int_;
                token::operator=(&local_78,&local_a0);
                token::destroy(&local_a0);
              }
              else if ((uVar4 < 2) &&
                      (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
                local_a0.type_ = interface_;
                token::operator=(&local_78,&local_a0);
                token::destroy(&local_a0);
              }
              else if ((ver_00 == es5) &&
                      (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
                local_a0.type_ = let_;
                token::operator=(&local_78,&local_a0);
                token::destroy(&local_a0);
              }
              else {
                if (ver_00 == es3) {
                  iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                  if (iVar5 == 0) {
                    local_a0.type_ = long_;
                    token::operator=(&local_78,&local_a0);
                    token::destroy(&local_a0);
                    goto LAB_00171e20;
                  }
                  iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                  if (iVar5 == 0) {
                    local_a0.type_ = native_;
                    token::operator=(&local_78,&local_a0);
                    token::destroy(&local_a0);
                    goto LAB_00171e20;
                  }
                }
                if (ver_00 < (es5|es3)) {
                  iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                  if (iVar5 == 0) {
                    local_a0.type_ = new_;
                    token::operator=(&local_78,&local_a0);
                    token::destroy(&local_a0);
                    goto LAB_00171e20;
                  }
                  iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                  if (iVar5 == 0) {
                    local_a0.type_ = null_;
                    token::operator=(&local_78,&local_a0);
                    token::destroy(&local_a0);
                    goto LAB_00171e20;
                  }
                }
                if (uVar4 < 2) {
                  iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                  if (iVar5 == 0) {
                    local_a0.type_ = package_;
                    token::operator=(&local_78,&local_a0);
                    token::destroy(&local_a0);
                    goto LAB_00171e20;
                  }
                  iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                  if (iVar5 == 0) {
                    local_a0.type_ = private_;
                    token::operator=(&local_78,&local_a0);
                    token::destroy(&local_a0);
                    goto LAB_00171e20;
                  }
                  iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                  if (iVar5 == 0) {
                    local_a0.type_ = protected_;
                    token::operator=(&local_78,&local_a0);
                    token::destroy(&local_a0);
                    goto LAB_00171e20;
                  }
                  iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                  if (iVar5 == 0) {
                    local_a0.type_ = public_;
                    token::operator=(&local_78,&local_a0);
                    token::destroy(&local_a0);
                    goto LAB_00171e20;
                  }
                }
                if ((ver_00 < (es5|es3)) &&
                   (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
                  local_a0.type_ = return_;
                  token::operator=(&local_78,&local_a0);
                  token::destroy(&local_a0);
                }
                else if ((ver_00 == es3) &&
                        (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0))
                {
                  local_a0.type_ = short_;
                  token::operator=(&local_78,&local_a0);
                  token::destroy(&local_a0);
                }
                else if ((uVar4 < 2) &&
                        (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0))
                {
                  local_a0.type_ = static_;
                  token::operator=(&local_78,&local_a0);
                  token::destroy(&local_a0);
                }
                else {
                  if (ver_00 < (es5|es3)) {
                    iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                    if (iVar5 == 0) {
                      local_a0.type_ = super_;
                      token::operator=(&local_78,&local_a0);
                      token::destroy(&local_a0);
                      goto LAB_00171e20;
                    }
                    iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                    if (iVar5 == 0) {
                      local_a0.type_ = switch_;
                      token::operator=(&local_78,&local_a0);
                      token::destroy(&local_a0);
                      goto LAB_00171e20;
                    }
                  }
                  if ((ver_00 == es3) &&
                     (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
                    local_a0.type_ = synchronized_;
                    token::operator=(&local_78,&local_a0);
                    token::destroy(&local_a0);
                  }
                  else {
                    if (ver_00 < (es5|es3)) {
                      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                      if (iVar5 == 0) {
                        local_a0.type_ = this_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                        goto LAB_00171e20;
                      }
                      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                      if (iVar5 == 0) {
                        local_a0.type_ = throw_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                        goto LAB_00171e20;
                      }
                    }
                    if (ver_00 == es3) {
                      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                      if (iVar5 == 0) {
                        local_a0.type_ = throws_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                        goto LAB_00171e20;
                      }
                      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                      if (iVar5 == 0) {
                        local_a0.type_ = transient_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                        goto LAB_00171e20;
                      }
                    }
                    if (ver_00 < (es5|es3)) {
                      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                      if (iVar5 == 0) {
                        local_a0.type_ = true_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                        goto LAB_00171e20;
                      }
                      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                      if (iVar5 == 0) {
                        local_a0.type_ = try_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                        goto LAB_00171e20;
                      }
                      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                      if (iVar5 == 0) {
                        local_a0.type_ = typeof_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                        goto LAB_00171e20;
                      }
                      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                      if (iVar5 == 0) {
                        local_a0.type_ = var_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                        goto LAB_00171e20;
                      }
                      iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                      if (iVar5 == 0) {
                        local_a0.type_ = void_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                        goto LAB_00171e20;
                      }
                    }
                    if ((ver_00 == es3) &&
                       (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0)) {
                      local_a0.type_ = volatile_;
                      token::operator=(&local_78,&local_a0);
                      token::destroy(&local_a0);
                    }
                    else {
                      if (ver_00 < (es5|es3)) {
                        iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                        if (iVar5 == 0) {
                          local_a0.type_ = while_;
                          token::operator=(&local_78,&local_a0);
                          token::destroy(&local_a0);
                          goto LAB_00171e20;
                        }
                        iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0);
                        if (iVar5 == 0) {
                          local_a0.type_ = with_;
                          token::operator=(&local_78,&local_a0);
                          token::destroy(&local_a0);
                          goto LAB_00171e20;
                        }
                      }
                      if ((ver_00 == es5) &&
                         (iVar5 = std::__cxx11::wstring::compare((wchar_t *)&local_c0), iVar5 == 0))
                      {
                        local_a0.type_ = yield_;
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                      }
                      else {
                        token::token(&local_a0,identifier,&local_c0);
                        token::operator=(&local_78,&local_a0);
                        token::destroy(&local_a0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00171e20:
  if ((bVar14) && (local_78.type_ != identifier)) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Unicode escape sequence used in keyword");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  token::token(&__return_storage_ptr__->first,&local_78);
  __return_storage_ptr__->second = (unsigned_long)paVar8;
  token::destroy(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<token, size_t> get_identifier(const std::wstring_view text, const size_t token_start, version ver) {
    auto token_end = token_start + 1;
    bool escape_sequence_used = text[token_start] == '\\';

    const auto exended_id_part = ver >= version::es5 ? is_identifier_part_v5 : is_identifier_part_v3;

    for (; token_end < text.size(); ++token_end) {
        const int ch = text[token_end];
        if (is_identifier_part_v1(ch)) {
            // OK - fast path
        } else if (ver < version::es3) {
            break;
        } else if (ch == '\\') {
            escape_sequence_used = true;
        } else if (!exended_id_part(ch)) {
            break;
        }
    }
    auto id = std::wstring{text.begin() + token_start, text.begin() + token_end};
    token tok{token_type::eof};
    if (escape_sequence_used) {
        id = replace_unicode_escape_sequences(id, ver);
    }
    if (0) {}
#define X(rw, first_ver, last_ver) else if (ver >= version::first_ver && ver <= version::last_ver && id == L ## #rw) { tok = token{token_type::rw ## _}; }
    MJS_KEYWORDS(X)
#undef X
else tok = token{token_type::identifier, id};

    if (escape_sequence_used && tok.type() != token_type::identifier) {
        throw std::runtime_error("Unicode escape sequence used in keyword");
    }

    return { tok, token_end };
}